

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

shared_ptr<Assimp::FIIntValue> __thiscall
Assimp::FIIntValue::create(FIIntValue *this,vector<int,_std::allocator<int>_> *value)

{
  pointer piVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<Assimp::FIIntValue> sVar2;
  
  piVar1 = (pointer)operator_new(0x58);
  piVar1[2] = 1;
  piVar1[3] = 1;
  *(undefined ***)piVar1 = &PTR___Sp_counted_ptr_inplace_0089e238;
  piVar1[6] = 0;
  piVar1[7] = 0;
  piVar1[8] = 0;
  piVar1[9] = 0;
  piVar1[10] = 0;
  piVar1[0xb] = 0;
  *(undefined ***)(piVar1 + 4) = &PTR_toString_abi_cxx11__0089e288;
  *(pointer *)(piVar1 + 0xc) = piVar1 + 0x10;
  piVar1[0xe] = 0;
  piVar1[0xf] = 0;
  *(undefined1 *)(piVar1 + 0x10) = 0;
  *(undefined1 *)(piVar1 + 0x14) = 0;
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            ((vector<int,_std::allocator<int>_> *)(piVar1 + 6),value);
  (this->super_FIValue)._vptr_FIValue = (_func_int **)(piVar1 + 4);
  (this->value).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = piVar1;
  sVar2.super___shared_ptr<Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Assimp::FIIntValue>)
         sVar2.super___shared_ptr<Assimp::FIIntValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FIIntValue> FIIntValue::create(std::vector<int32_t> &&value) {
    return std::make_shared<FIIntValueImpl>(std::move(value));
}